

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::AdamOptimizer::MergeFrom(AdamOptimizer *this,AdamOptimizer *from)

{
  void *pvVar1;
  LogMessage *other;
  DoubleParameter *pDVar2;
  Int64Parameter *this_00;
  DoubleParameter *pDVar3;
  Int64Parameter *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O2/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x125e1);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  if ((from != (AdamOptimizer *)&_AdamOptimizer_default_instance_) &&
     (from->learningrate_ != (DoubleParameter *)0x0)) {
    pDVar2 = mutable_learningrate(this);
    pDVar3 = from->learningrate_;
    if (pDVar3 == (DoubleParameter *)0x0) {
      pDVar3 = (DoubleParameter *)&_DoubleParameter_default_instance_;
    }
    DoubleParameter::MergeFrom(pDVar2,pDVar3);
  }
  if ((from != (AdamOptimizer *)&_AdamOptimizer_default_instance_) &&
     (from->minibatchsize_ != (Int64Parameter *)0x0)) {
    this_00 = mutable_minibatchsize(this);
    from_00 = from->minibatchsize_;
    if (from_00 == (Int64Parameter *)0x0) {
      from_00 = (Int64Parameter *)&_Int64Parameter_default_instance_;
    }
    Int64Parameter::MergeFrom(this_00,from_00);
  }
  if ((from != (AdamOptimizer *)&_AdamOptimizer_default_instance_) &&
     (from->beta1_ != (DoubleParameter *)0x0)) {
    pDVar2 = mutable_beta1(this);
    pDVar3 = from->beta1_;
    if (pDVar3 == (DoubleParameter *)0x0) {
      pDVar3 = (DoubleParameter *)&_DoubleParameter_default_instance_;
    }
    DoubleParameter::MergeFrom(pDVar2,pDVar3);
  }
  if ((from != (AdamOptimizer *)&_AdamOptimizer_default_instance_) &&
     (from->beta2_ != (DoubleParameter *)0x0)) {
    pDVar2 = mutable_beta2(this);
    pDVar3 = from->beta2_;
    if (pDVar3 == (DoubleParameter *)0x0) {
      pDVar3 = (DoubleParameter *)&_DoubleParameter_default_instance_;
    }
    DoubleParameter::MergeFrom(pDVar2,pDVar3);
  }
  if ((from != (AdamOptimizer *)&_AdamOptimizer_default_instance_) &&
     (from->eps_ != (DoubleParameter *)0x0)) {
    pDVar2 = mutable_eps(this);
    pDVar3 = from->eps_;
    if (pDVar3 == (DoubleParameter *)0x0) {
      pDVar3 = (DoubleParameter *)&_DoubleParameter_default_instance_;
    }
    DoubleParameter::MergeFrom(pDVar2,pDVar3);
  }
  return;
}

Assistant:

void AdamOptimizer::MergeFrom(const AdamOptimizer& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.AdamOptimizer)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_learningrate()) {
    mutable_learningrate()->::CoreML::Specification::DoubleParameter::MergeFrom(from.learningrate());
  }
  if (from.has_minibatchsize()) {
    mutable_minibatchsize()->::CoreML::Specification::Int64Parameter::MergeFrom(from.minibatchsize());
  }
  if (from.has_beta1()) {
    mutable_beta1()->::CoreML::Specification::DoubleParameter::MergeFrom(from.beta1());
  }
  if (from.has_beta2()) {
    mutable_beta2()->::CoreML::Specification::DoubleParameter::MergeFrom(from.beta2());
  }
  if (from.has_eps()) {
    mutable_eps()->::CoreML::Specification::DoubleParameter::MergeFrom(from.eps());
  }
}